

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

bool __thiscall MipsElfFile::seekPhysical(MipsElfFile *this,int64_t physicalAddress)

{
  pointer ppEVar1;
  ElfSegment *pEVar2;
  pointer ppEVar3;
  ElfSection *pEVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *text;
  long lVar9;
  long lVar10;
  
  ppEVar1 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = 0;
  do {
    if ((long)(this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3 == lVar7) {
      ppEVar3 = (this->elf).segmentlessSections.
                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar7 = 0;
          (long)(this->elf).segmentlessSections.
                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3 != lVar7; lVar7 = lVar7 + 1)
      {
        pEVar4 = ppEVar3[lVar7];
        uVar8 = (ulong)(pEVar4->header).sh_offset;
        if (((long)uVar8 <= physicalAddress) &&
           (physicalAddress < (long)((pEVar4->header).sh_size + uVar8))) {
          this->segment = -1;
          this->section = (int)lVar7;
          this->sectionOffset = physicalAddress - uVar8;
          return true;
        }
      }
      this->segment = -1;
      this->section = -1;
      text = "Couldn\'t find a section";
LAB_0016f2c0:
      Logger::queueError<>(Error,text);
      return false;
    }
    pEVar2 = ppEVar1[lVar7];
    uVar8 = (ulong)(pEVar2->header).p_offset;
    if (((long)uVar8 <= physicalAddress) &&
       (physicalAddress < (long)((pEVar2->header).p_filesz + uVar8))) {
      lVar5 = *(long *)&(pEVar2->sections).
                        super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                        super__Vector_impl_data;
      for (lVar9 = 0;
          (long)*(pointer *)
                 ((long)&(pEVar2->sections).
                         super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl + 8
                 ) - lVar5 >> 3 != lVar9; lVar9 = lVar9 + 1) {
        lVar6 = *(long *)(lVar5 + lVar9 * 8);
        lVar10 = *(uint *)(lVar6 + 0x10) + uVar8;
        if ((lVar10 <= physicalAddress) &&
           (physicalAddress < (long)(lVar10 + (ulong)*(uint *)(lVar6 + 0x14)))) {
          this->segment = (int)lVar7;
          this->section = (int)lVar9;
          this->sectionOffset = physicalAddress - lVar10;
          return true;
        }
      }
      text = "Found segment, but no containing section";
      goto LAB_0016f2c0;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool MipsElfFile::seekPhysical(int64_t physicalAddress)
{
	// search in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int64_t segStart = seg->getOffset();
		int64_t segEnd = segStart+seg->getPhysSize();

		if (segStart <= physicalAddress && physicalAddress < segEnd)
		{
			// find section
			for (size_t l = 0; l < seg->getSectionCount(); l++)
			{
				ElfSection* sect = seg->getSection(l);
				int64_t sectStart = segStart+sect->getOffset();
				int64_t sectEnd = sectStart+sect->getSize();
				
				if (sectStart <= physicalAddress && physicalAddress < sectEnd)
				{
					segment = (int) i;
					section = (int) l;
					sectionOffset = physicalAddress-sectStart;
					return true;
				}
			}

			Logger::queueError(Logger::Error, "Found segment, but no containing section");
			return false;
		}
	}

	// search in segmentless sections
	for (size_t i = 0; i < elf.getSegmentlessSectionCount(); i++)
	{
		ElfSection* sect = elf.getSegmentlessSection(i);
		int64_t sectStart = sect->getOffset();
		int64_t sectEnd = sectStart+sect->getSize();
		
		if (sectStart <= physicalAddress && physicalAddress < sectEnd)
		{
			segment = -1;
			section = (int) i;
			sectionOffset = physicalAddress-sectStart;
			return true;
		}
	}

	segment = -1;
	section = -1;
	Logger::queueError(Logger::Error, "Couldn't find a section");
	return false;
}